

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O0

void __thiscall
test::environment_var_location_not_defined::test_method(environment_var_location_not_defined *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  AuditEvent *pAVar4;
  basic_cstring<const_char> local_250;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  size_type local_1e8;
  undefined4 local_1dc;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1c8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> local_170;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]> local_108;
  assertion_result local_e8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  undefined1 local_88 [8];
  EnvironmentVarLocation environmentVarLocation;
  EventRegistry registry;
  environment_var_location_not_defined *this_local;
  
  unsetenv("LICENSE_LOCATION");
  license::EventRegistry::EventRegistry
            ((EventRegistry *)
             ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2 + 8));
  license::locate::EnvironmentVarLocation::EnvironmentVarLocation
            ((EnvironmentVarLocation *)local_88);
  license::locate::EnvironmentVarLocation::license_locations_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,(EnvironmentVarLocation *)local_88,
             (EventRegistry *)
             ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2 + 8));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c0,0xb6,&local_d0);
    bVar2 = license::EventRegistry::isGood
                      ((EventRegistry *)
                       ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2
                       + 8));
    boost::test_tools::assertion_result::assertion_result(&local_e8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_108,plVar3,(char (*) [38])"No fatal error for now, only warnings");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_118,0xb6,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>::
    ~lazy_ostream_impl(&local_108);
    boost::test_tools::assertion_result::~assertion_result(&local_e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  license::EventRegistry::turnWarningsIntoErrors
            ((EventRegistry *)
             ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2 + 8));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_128,0xb8,&local_138);
    bVar2 = license::EventRegistry::isGood
                      ((EventRegistry *)
                       ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2
                       + 8));
    boost::test_tools::assertion_result::assertion_result(&local_150,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,plVar3,(char (*) [15])"Error detected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::test_tools::tt_detail::report_assertion(&local_150,&local_170,&local_180,0xb8,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>::
    ~lazy_ostream_impl(&local_170);
    boost::test_tools::assertion_result::~assertion_result(&local_150);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_190,0xb9,&local_1a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c8,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    local_1dc = 0;
    local_1e8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_1c8,&local_1d8,0xb9,1,2,&local_1dc,"0",&local_1e8,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1f8,0xba,&local_208);
    pAVar4 = license::EventRegistry::getLastFailure
                       ((EventRegistry *)
                        ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2
                        + 8));
    boost::test_tools::assertion_result::assertion_result
              (&local_220,pAVar4->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_240,plVar3,(char (*) [15])"Error detected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/LicenseLocator_test.cpp"
               ,0x77);
    boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&local_250,0xba,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>::
    ~lazy_ostream_impl(&local_240);
    boost::test_tools::assertion_result::~assertion_result(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
  license::locate::EnvironmentVarLocation::~EnvironmentVarLocation
            ((EnvironmentVarLocation *)local_88);
  license::EventRegistry::~EventRegistry
            ((EventRegistry *)
             ((long)&environmentVarLocation.super_LocatorStrategy.m_strategy_name.field_2 + 8));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(environment_var_location_not_defined) {
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
	license::EventRegistry registry;
	EnvironmentVarLocation environmentVarLocation;
	vector<string> licenseInfos = environmentVarLocation.license_locations(registry);

	BOOST_CHECK_MESSAGE(registry.isGood(), "No fatal error for now, only warnings");
	registry.turnWarningsIntoErrors();
	BOOST_REQUIRE_MESSAGE(!registry.isGood(), "Error detected");
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_CHECK_MESSAGE(registry.getLastFailure()->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED, "Error detected");
}